

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * __thiscall llvm::raw_ostream::operator<<(raw_ostream *this,FormattedBytes *FB)

{
  byte bVar1;
  uchar C;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint64_t uVar6;
  unsigned_long *puVar7;
  raw_ostream *S;
  size_t sVar8;
  byte *pbVar9;
  iterator puVar10;
  undefined8 in_R9;
  Optional<unsigned_long> Width;
  Optional<unsigned_long> Width_00;
  ArrayRef<unsigned_char> AVar11;
  uchar *local_100;
  uchar *local_f8;
  uint8_t Byte;
  iterator __end3;
  iterator __begin3;
  ArrayRef<unsigned_char> *__range3;
  Optional<unsigned_long> local_c8;
  ulong local_b8;
  size_t I;
  size_t CharsPrinted;
  ArrayRef<unsigned_char> Line;
  byte local_90;
  uint64_t Offset;
  uint BlockCharWidth;
  uint NumByteGroups;
  unsigned_long local_70;
  uint local_64;
  uint64_t uStack_60;
  uint Power;
  uint64_t MaxOffset;
  size_t Lines;
  uint64_t OffsetWidth;
  size_t sStack_40;
  HexPrintStyle HPS;
  size_t Size;
  ArrayRef<unsigned_char> Bytes;
  size_t LineIndex;
  FormattedBytes *FB_local;
  raw_ostream *this_local;
  
  bVar4 = ArrayRef<unsigned_char>::empty(&FB->Bytes);
  if (!bVar4) {
    Bytes.Length = 0;
    Size = (size_t)(FB->Bytes).Data;
    Bytes.Data = (uchar *)(FB->Bytes).Length;
    sStack_40 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&Size);
    OffsetWidth._4_4_ = (uint)((FB->Upper & 1U) == 0);
    Lines = 0;
    bVar4 = Optional<unsigned_long>::hasValue(&FB->FirstByteOffset);
    if (bVar4) {
      MaxOffset = sStack_40 / FB->NumPerLine;
      puVar7 = Optional<unsigned_long>::operator*(&FB->FirstByteOffset);
      uStack_60 = *puVar7 + MaxOffset * FB->NumPerLine;
      local_64 = 0;
      if (uStack_60 != 0) {
        local_64 = Log2_64_Ceil(uStack_60);
      }
      local_70 = 4;
      uVar6 = alignTo((ulong)local_64,4,0);
      _BlockCharWidth = uVar6 >> 2;
      puVar7 = std::max<unsigned_long>(&local_70,(unsigned_long *)&BlockCharWidth);
      Lines = *puVar7;
    }
    uVar6 = alignTo((ulong)FB->NumPerLine,(ulong)FB->ByteGroupSize,0);
    uVar5 = (FB->NumPerLine * 2 + (int)(uVar6 / FB->ByteGroupSize)) - 1;
    while (bVar4 = ArrayRef<unsigned_char>::empty((ArrayRef<unsigned_char> *)&Size),
          ((bVar4 ^ 0xffU) & 1) != 0) {
      indent(this,FB->IndentLevel);
      bVar4 = Optional<unsigned_long>::hasValue(&FB->FirstByteOffset);
      if (bVar4) {
        puVar7 = Optional<unsigned_long>::getValue(&FB->FirstByteOffset);
        uVar3 = OffsetWidth._4_4_;
        S = (raw_ostream *)(*puVar7 + Bytes.Length);
        Optional<unsigned_long>::Optional((Optional<unsigned_long> *)&Line.Length,&Lines);
        Width.Storage.field_0.value._1_7_ = 0;
        Width.Storage.field_0.empty = local_90;
        Width.Storage._8_8_ = in_R9;
        llvm::write_hex((llvm *)this,S,(ulong)uVar3,(HexPrintStyle)Line.Length,Width);
        operator<<(this,": ");
      }
      _CharsPrinted =
           ArrayRef<unsigned_char>::take_front
                     ((ArrayRef<unsigned_char> *)&Size,(ulong)FB->NumPerLine);
      I = 0;
      for (local_b8 = 0; uVar2 = local_b8,
          sVar8 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&CharsPrinted),
          uVar2 < sVar8; local_b8 = local_b8 + 1) {
        if ((local_b8 != 0) && (local_b8 % (ulong)FB->ByteGroupSize == 0)) {
          I = I + 1;
          operator<<(this," ");
        }
        pbVar9 = ArrayRef<unsigned_char>::operator[]
                           ((ArrayRef<unsigned_char> *)&CharsPrinted,local_b8);
        uVar3 = OffsetWidth._4_4_;
        bVar1 = *pbVar9;
        __range3 = (ArrayRef<unsigned_char> *)0x2;
        Optional<unsigned_long>::Optional(&local_c8,(unsigned_long *)&__range3);
        Width_00.Storage.field_0.value._1_7_ = 0;
        Width_00.Storage.field_0.empty = local_c8.Storage.hasVal;
        Width_00.Storage._8_8_ = in_R9;
        llvm::write_hex((llvm *)this,(raw_ostream *)(ulong)bVar1,(ulong)uVar3,
                        (HexPrintStyle)local_c8.Storage.field_0.value,Width_00);
        I = I + 2;
      }
      if ((FB->ASCII & 1U) != 0) {
        if (uVar5 < I) {
          __assert_fail("BlockCharWidth >= CharsPrinted",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/raw_ostream.cpp"
                        ,0x1c7,"raw_ostream &llvm::raw_ostream::operator<<(const FormattedBytes &)")
          ;
        }
        indent(this,(uVar5 - (int)I) + 2);
        operator<<(this,"|");
        __end3 = ArrayRef<unsigned_char>::begin((ArrayRef<unsigned_char> *)&CharsPrinted);
        puVar10 = ArrayRef<unsigned_char>::end((ArrayRef<unsigned_char> *)&CharsPrinted);
        for (; __end3 != puVar10; __end3 = __end3 + 1) {
          C = *__end3;
          bVar4 = isPrint(C);
          if (bVar4) {
            operator<<(this,C);
          }
          else {
            operator<<(this,'.');
          }
        }
        operator<<(this,'|');
      }
      sVar8 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&CharsPrinted);
      AVar11 = ArrayRef<unsigned_char>::drop_front((ArrayRef<unsigned_char> *)&Size,sVar8);
      local_100 = AVar11.Data;
      Size = (size_t)local_100;
      local_f8 = (uchar *)AVar11.Length;
      Bytes.Data = local_f8;
      sVar8 = ArrayRef<unsigned_char>::size((ArrayRef<unsigned_char> *)&CharsPrinted);
      Bytes.Length = sVar8 + Bytes.Length;
      if (Bytes.Length < sStack_40) {
        operator<<(this,'\n');
      }
    }
  }
  return this;
}

Assistant:

raw_ostream &raw_ostream::operator<<(const FormattedBytes &FB) {
  if (FB.Bytes.empty())
    return *this;

  size_t LineIndex = 0;
  auto Bytes = FB.Bytes;
  const size_t Size = Bytes.size();
  HexPrintStyle HPS = FB.Upper ? HexPrintStyle::Upper : HexPrintStyle::Lower;
  uint64_t OffsetWidth = 0;
  if (FB.FirstByteOffset.hasValue()) {
    // Figure out how many nibbles are needed to print the largest offset
    // represented by this data set, so that we can align the offset field
    // to the right width.
    size_t Lines = Size / FB.NumPerLine;
    uint64_t MaxOffset = *FB.FirstByteOffset + Lines * FB.NumPerLine;
    unsigned Power = 0;
    if (MaxOffset > 0)
      Power = llvm::Log2_64_Ceil(MaxOffset);
    OffsetWidth = std::max<uint64_t>(4, llvm::alignTo(Power, 4) / 4);
  }

  // The width of a block of data including all spaces for group separators.
  unsigned NumByteGroups =
      alignTo(FB.NumPerLine, FB.ByteGroupSize) / FB.ByteGroupSize;
  unsigned BlockCharWidth = FB.NumPerLine * 2 + NumByteGroups - 1;

  while (!Bytes.empty()) {
    indent(FB.IndentLevel);

    if (FB.FirstByteOffset.hasValue()) {
      uint64_t Offset = FB.FirstByteOffset.getValue();
      llvm::write_hex(*this, Offset + LineIndex, HPS, OffsetWidth);
      *this << ": ";
    }

    auto Line = Bytes.take_front(FB.NumPerLine);

    size_t CharsPrinted = 0;
    // Print the hex bytes for this line in groups
    for (size_t I = 0; I < Line.size(); ++I, CharsPrinted += 2) {
      if (I && (I % FB.ByteGroupSize) == 0) {
        ++CharsPrinted;
        *this << " ";
      }
      llvm::write_hex(*this, Line[I], HPS, 2);
    }

    if (FB.ASCII) {
      // Print any spaces needed for any bytes that we didn't print on this
      // line so that the ASCII bytes are correctly aligned.
      assert(BlockCharWidth >= CharsPrinted);
      indent(BlockCharWidth - CharsPrinted + 2);
      *this << "|";

      // Print the ASCII char values for each byte on this line
      for (uint8_t Byte : Line) {
        if (isPrint(Byte))
          *this << static_cast<char>(Byte);
        else
          *this << '.';
      }
      *this << '|';
    }

    Bytes = Bytes.drop_front(Line.size());
    LineIndex += Line.size();
    if (LineIndex < Size)
      *this << '\n';
  }
  return *this;
}